

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

char * __thiscall
llvm::ItaniumPartialDemangler::getFunctionReturnType
          (ItaniumPartialDemangler *this,char *Buf,size_t *N)

{
  bool bVar1;
  Node *this_00;
  size_t sVar2;
  Node *Ret;
  OutputStream S;
  size_t *N_local;
  char *Buf_local;
  ItaniumPartialDemangler *this_local;
  
  S._24_8_ = N;
  bVar1 = isFunction(this);
  if (bVar1) {
    OutputStream::OutputStream((OutputStream *)&Ret);
    bVar1 = anon_unknown.dwarf_24939c::initializeOutputStream
                      (Buf,(size_t *)S._24_8_,(OutputStream *)&Ret,0x80);
    if (bVar1) {
      this_local = (ItaniumPartialDemangler *)0x0;
    }
    else {
      this_00 = anon_unknown.dwarf_24939c::FunctionEncoding::getReturnType
                          ((FunctionEncoding *)this->RootNode);
      if (this_00 != (Node *)0x0) {
        anon_unknown.dwarf_24939c::Node::print(this_00,(OutputStream *)&Ret);
      }
      OutputStream::operator+=((OutputStream *)&Ret,'\0');
      if (S._24_8_ != 0) {
        sVar2 = OutputStream::getCurrentPosition((OutputStream *)&Ret);
        *(size_t *)S._24_8_ = sVar2;
      }
      this_local = (ItaniumPartialDemangler *)OutputStream::getBuffer((OutputStream *)&Ret);
    }
  }
  else {
    this_local = (ItaniumPartialDemangler *)0x0;
  }
  return (char *)this_local;
}

Assistant:

char *ItaniumPartialDemangler::getFunctionReturnType(
    char *Buf, size_t *N) const {
  if (!isFunction())
    return nullptr;

  OutputStream S;
  if (initializeOutputStream(Buf, N, S, 128))
    return nullptr;

  if (Node *Ret = static_cast<FunctionEncoding *>(RootNode)->getReturnType())
    Ret->print(S);

  S += '\0';
  if (N != nullptr)
    *N = S.getCurrentPosition();
  return S.getBuffer();
}